

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  RepeatedField<int> *this_00;
  int iVar1;
  SourceCodeInfo_Location *pSVar2;
  int *piVar3;
  const_reference piVar4;
  Rep *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  
  if (out_location == (SourceLocation *)0x0) {
    GetSourceLocation();
  }
  else {
    if ((this->source_code_info_ == (SourceCodeInfo *)0x0) ||
       (pSVar2 = FileDescriptorTables::GetSourceLocation(this->tables_,path,this->source_code_info_)
       , pSVar2 == (SourceCodeInfo_Location *)0x0)) {
      return false;
    }
    this_00 = &(pSVar2->field_0)._impl_.span_;
    iVar1 = protobuf::internal::SooRep::size
                      (&this_00->soo_rep_,(*(byte *)((long)&pSVar2->field_0 + 0x20) & 4) == 0);
    if ((iVar1 != 3) &&
       (iVar1 = protobuf::internal::SooRep::size
                          (&this_00->soo_rep_,
                           (undefined1  [16])
                           ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
                           == (undefined1  [16])0x0), iVar1 != 4)) {
      return false;
    }
    iVar1 = protobuf::internal::SooRep::size
                      (&this_00->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (0 < iVar1) {
      piVar3 = RepeatedField<int>::elements
                         (this_00,(undefined1  [16])
                                  ((undefined1  [16])(this_00->soo_rep_).field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
      out_location->start_line = *piVar3;
      iVar1 = protobuf::internal::SooRep::size
                        (&this_00->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      if (1 < iVar1) {
        piVar3 = RepeatedField<int>::elements
                           (this_00,(*(byte *)((long)&pSVar2->field_0 + 0x20) & 4) == 0);
        out_location->start_column = piVar3[1];
        iVar1 = protobuf::internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&pSVar2->field_0 + 0x20) & 4) == 0);
        piVar4 = RepeatedField<int>::Get(this_00,(uint)(iVar1 != 3) * 2);
        out_location->end_line = *piVar4;
        iVar1 = protobuf::internal::SooRep::size
                          (&this_00->soo_rep_,(*(byte *)((long)&pSVar2->field_0 + 0x20) & 4) == 0);
        piVar4 = RepeatedField<int>::Get(this_00,iVar1 + -1);
        out_location->end_column = *piVar4;
        std::__cxx11::string::_M_assign((string *)&out_location->leading_comments);
        std::__cxx11::string::_M_assign((string *)&out_location->trailing_comments);
        this_01 = &(pSVar2->field_0)._impl_.leading_detached_comments_;
        pRVar6 = this_01;
        if ((*(byte *)((long)&pSVar2->field_0 + 0x38) & 1) != 0) {
          pRVar5 = protobuf::internal::RepeatedPtrFieldBase::rep
                             (&this_01->super_RepeatedPtrFieldBase);
          pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pRVar5->elements;
          if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
            pRVar5 = protobuf::internal::RepeatedPtrFieldBase::rep
                               (&this_01->super_RepeatedPtrFieldBase);
            this_01 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)pRVar5->elements;
          }
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &out_location->leading_detached_comments,pRVar6,
                   &(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                   *(int *)((long)&pSVar2->field_0 + 0x40));
        return true;
      }
      goto LAB_00ee1239;
    }
  }
  GetSourceLocation();
LAB_00ee1239:
  GetSourceLocation();
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  ABSL_CHECK(out_location != nullptr);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
            tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32_t>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}